

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * __thiscall
Kvm::makeOutputPort(Kvm *this,
                   unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *output)

{
  Value *pVVar1;
  
  pVVar1 = Kgc::allocValue(&this->gc_,OUTPUT_PORT);
  std::
  __uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::operator=((__uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               *)(pVVar1 + 1),
              (__uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               *)output);
  return pVVar1;
}

Assistant:

const Value* Kvm::makeOutputPort(std::unique_ptr<std::ofstream> output)
{
    OutputPort *op = static_cast<OutputPort *>(gc_.allocValue(ValueType::OUTPUT_PORT));
    op->output = std::move(output);
    return op;
}